

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtest.c
# Opt level: O2

int main(void)

{
  PmError PVar1;
  int iVar2;
  int iVar3;
  PmQueue *q;
  long *msg2_00;
  int iVar4;
  char *__s;
  uint n;
  bool bVar5;
  long msg2 [100];
  long msg [100];
  
  n = 4;
  while( true ) {
    __s = "Could not allocate queue";
    if (99 < n) {
      return 0;
    }
    q = Pm_QueueCreate(100,n * 8);
    printf("msg_len = %d\n",(ulong)n);
    if (q == (PmQueue *)0x0) break;
    puts("test 1");
    iVar4 = 0;
    while (iVar4 != 0x54d) {
      make_msg(msg,n,iVar4);
      PVar1 = Pm_Enqueue(q,msg);
      if (PVar1 != pmNoData) goto LAB_001029a8;
      PVar1 = Pm_Dequeue(q,msg2);
      if (PVar1 != pmGotData) goto LAB_001029b1;
      iVar2 = cmp_msg(msg,msg2,n,iVar4);
      iVar4 = iVar4 + 1;
      if (iVar2 == 0) {
        return 1;
      }
    }
    puts("test 2");
    iVar4 = 0;
    while (iVar4 != 100) {
      make_msg(msg,n,iVar4);
      PVar1 = Pm_Enqueue(q,msg);
      iVar4 = iVar4 + 1;
      if (PVar1 != pmNoData) goto LAB_001029a8;
    }
    iVar2 = 0x46e;
    iVar4 = 100;
    while (bVar5 = iVar2 != 0, iVar2 = iVar2 + -1, bVar5) {
      make_msg(msg,n,iVar4 + -100);
      PVar1 = Pm_Dequeue(q,msg2);
      if (PVar1 != pmGotData) goto LAB_001029b1;
      iVar3 = cmp_msg(msg,msg2,n,iVar4);
      if (iVar3 == 0) {
        return 1;
      }
      make_msg(msg,n,iVar4);
      PVar1 = Pm_Enqueue(q,msg);
      iVar4 = iVar4 + 1;
      if (PVar1 != pmNoData) goto LAB_001029a8;
    }
    iVar4 = 0x46e;
    while (iVar2 = Pm_QueueEmpty(q), iVar2 == 0) {
      make_msg(msg,n,iVar4);
      PVar1 = Pm_Dequeue(q,msg2);
      if (PVar1 != pmGotData) goto LAB_001029b1;
      iVar2 = cmp_msg(msg,msg2,n,iVar4 + 100);
      if (iVar2 == 0) {
        return 1;
      }
      iVar4 = iVar4 + 1;
    }
    if (iVar4 != 0x4d2) {
      __s = "Message count error";
      break;
    }
    puts("test 3");
    iVar4 = 0;
    do {
      if (iVar4 == 0x6e) break;
      make_msg(msg,n,iVar4);
      PVar1 = Pm_Enqueue(q,msg);
      iVar4 = iVar4 + 1;
    } while (PVar1 != pmBufferOverflow);
    iVar4 = 0;
    while (iVar4 != 100) {
      make_msg(msg,n,iVar4);
      PVar1 = Pm_Dequeue(q,msg2);
      if (PVar1 != pmGotData) goto LAB_001029b1;
      iVar2 = cmp_msg(msg,msg2,n,iVar4);
      iVar4 = iVar4 + 1;
      if (iVar2 == 0) {
        return 1;
      }
    }
    PVar1 = Pm_Dequeue(q,msg2);
    if (PVar1 != pmBufferOverflow) {
      __s = "Pm_Dequeue overflow expected";
      break;
    }
    puts("test 4");
    iVar4 = 0;
    while (iVar4 != 0x54d) {
      make_msg(msg,n,iVar4);
      PVar1 = Pm_Enqueue(q,msg);
      if (PVar1 != pmNoData) goto LAB_001029a8;
      msg2_00 = (long *)Pm_QueuePeek(q);
      iVar2 = cmp_msg(msg,msg2_00,n,iVar4);
      if (iVar2 == 0) {
        return 1;
      }
      PVar1 = Pm_Dequeue(q,msg2);
      if (PVar1 != pmGotData) goto LAB_001029b1;
      iVar2 = cmp_msg(msg,msg2,n,iVar4);
      iVar4 = iVar4 + 1;
      if (iVar2 == 0) {
        return 1;
      }
    }
    Pm_QueueDestroy(q);
    n = n + 5;
  }
LAB_001029b8:
  puts(__s);
  return 1;
LAB_001029a8:
  __s = "Pm_Enqueue error";
  goto LAB_001029b8;
LAB_001029b1:
  __s = "Pm_Dequeue error";
  goto LAB_001029b8;
}

Assistant:

int main()
{
    int msg_len;
    for (msg_len = 4; msg_len < 100; msg_len += 5) {
        PmQueue *queue = Pm_QueueCreate(100, msg_len * sizeof(long));
        int i;
        long msg[100];
        long msg2[100];

	printf("msg_len = %d\n", msg_len);
        if (!queue) {
            printf("Could not allocate queue\n");
            return 1;
        }
    
        /* insert/remove 1000 messages */
        printf("test 1\n");
        for (i = 0; i < 1357; i++) {
            make_msg(msg, msg_len, i);
            if (Pm_Enqueue(queue, msg)) {
                printf("Pm_Enqueue error\n");
                return 1;
            }
            if (Pm_Dequeue(queue, msg2) != 1) {
                printf("Pm_Dequeue error\n");
                return 1;
            }
            if (!cmp_msg(msg, msg2, msg_len, i)) {
                return 1;
            }
        }
    
        /* make full */
        printf("test 2\n");
        for (i = 0; i < 100; i++) {
            make_msg(msg, msg_len, i);
            if (Pm_Enqueue(queue, msg)) {
                printf("Pm_Enqueue error\n");
                return 1;
            }
        }
    
        /* alternately remove and insert */
        for (i = 100; i < 1234; i++) {
            make_msg(msg, msg_len, i - 100); /* what we expect */
            if (Pm_Dequeue(queue, msg2) != 1) {
                printf("Pm_Dequeue error\n");
                return 1;
            }
            if (!cmp_msg(msg, msg2, msg_len, i)) {
                return 1;
            }
            make_msg(msg, msg_len, i);
            if (Pm_Enqueue(queue, msg)) {
                printf("Pm_Enqueue error\n");
                return 1;
            }
        }
    
        /* remove all */
        while (!Pm_QueueEmpty(queue)) {
            make_msg(msg, msg_len, i - 100); /* what we expect */
            if (Pm_Dequeue(queue, msg2) != 1) {
                printf("Pm_Dequeue error\n");
                return 1;
            }
            if (!cmp_msg(msg, msg2, msg_len, i)) {
                return 1;
            }
            i++;
        }
        if (i != 1334) {
            printf("Message count error\n");
	    return 1;
        }
    
        /* now test overflow */
        printf("test 3\n");
        for (i = 0; i < 110; i++) {
            make_msg(msg, msg_len, i);
            if (Pm_Enqueue(queue, msg) == pmBufferOverflow) {
	        break; /* this is supposed to execute after 100 messages */
            }
        }
        for (i = 0; i < 100; i++) {
            make_msg(msg, msg_len, i);
            if (Pm_Dequeue(queue, msg2) != 1) {
                printf("Pm_Dequeue error\n");
		return 1;
            }
            if (!cmp_msg(msg, msg2, msg_len, i)) {
                return 1;
            }
        }
	/* we should detect overflow after removing 100 messages */
        if (Pm_Dequeue(queue, msg2) != pmBufferOverflow) {
            printf("Pm_Dequeue overflow expected\n");
	    return 1;
        }
    
	/* after overflow is detected (and cleared), sender can
	 * send again
	 */
        /* see if function is restored, also test peek */
        printf("test 4\n");
        for (i = 0; i < 1357; i++) {
            long *peek;
            make_msg(msg, msg_len, i);
            if (Pm_Enqueue(queue, msg)) {
                printf("Pm_Enqueue error\n");
                return 1;
            }
            peek = (long *) Pm_QueuePeek(queue);
            if (!cmp_msg(msg, peek, msg_len, i)) {
	        return 1;
            }
            if (Pm_Dequeue(queue, msg2) != 1) {
                printf("Pm_Dequeue error\n");
	        return 1;
            }
            if (!cmp_msg(msg, msg2, msg_len, i)) {
	        return 1;
            }
        }
        Pm_QueueDestroy(queue);
    }
    return 0;
}